

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# RegularExpression.cxx
# Opt level: O2

char * __thiscall cmsys::RegExpCompile::regnode(RegExpCompile *this,char op)

{
  char *pcVar1;
  
  pcVar1 = this->regcode;
  if (pcVar1 != &regdummy) {
    *pcVar1 = op;
    pcVar1[1] = '\0';
    pcVar1[2] = '\0';
    this->regcode = pcVar1 + 3;
    return pcVar1;
  }
  this->regsize = this->regsize + 3;
  return pcVar1;
}

Assistant:

char* RegExpCompile::regnode(char op)
{
  char* ret;
  char* ptr;

  ret = regcode;
  if (ret == regdummyptr) {
    regsize += 3;
    return (ret);
  }

  ptr = ret;
  *ptr++ = op;
  *ptr++ = '\0'; // Null "next" pointer.
  *ptr++ = '\0';
  regcode = ptr;

  return (ret);
}